

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_14::parseIntOption
               (int argc,char **argv,char *pattern,optionType type,int *res)

{
  undefined1 uVar1;
  byte bVar2;
  int iVar3;
  char *__nptr;
  int in_ECX;
  String *in_RSI;
  undefined4 in_EDI;
  int *in_R8;
  int theInt;
  uint i;
  char negative [4] [6];
  char positive [4] [5];
  String parsedValue;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined2 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3a;
  undefined1 in_stack_ffffffffffffff3b;
  undefined4 local_ac;
  undefined1 local_1;
  
  String::String((String *)0x10edaa);
  String::String((String *)0x10eddc);
  uVar1 = parseOption((int)in_RSI,
                      (char **)CONCAT44(in_EDI,CONCAT13(in_stack_ffffffffffffff3b,
                                                        CONCAT12(in_stack_ffffffffffffff3a,
                                                                 in_stack_ffffffffffffff38))),
                      (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (String *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                      (String *)0x10ee01);
  bVar2 = uVar1 ^ 0xff;
  String::~String(in_RSI);
  if ((bVar2 & 1) == 0) {
    if (in_ECX == 0) {
      for (local_ac = 0; local_ac < 4; local_ac = local_ac + 1) {
        in_stack_ffffffffffffff34 =
             String::compare((String *)
                             CONCAT44(in_EDI,CONCAT13(uVar1,CONCAT12(bVar2,in_stack_ffffffffffffff38
                                                                    ))),
                             (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             (bool)in_stack_ffffffffffffff2f);
        if (in_stack_ffffffffffffff34 == 0) {
          *in_R8 = 1;
          local_1 = true;
          goto LAB_0010efdc;
        }
        in_stack_ffffffffffffff30 =
             String::compare((String *)
                             CONCAT44(in_EDI,CONCAT13(uVar1,CONCAT12(bVar2,in_stack_ffffffffffffff38
                                                                    ))),
                             (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             (bool)in_stack_ffffffffffffff2f);
        if (in_stack_ffffffffffffff30 == 0) {
          *in_R8 = 0;
          local_1 = true;
          goto LAB_0010efdc;
        }
      }
    }
    else {
      __nptr = String::c_str((String *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28)
                            );
      iVar3 = atoi(__nptr);
      if (iVar3 != 0) {
        *in_R8 = iVar3;
        local_1 = true;
        goto LAB_0010efdc;
      }
    }
    local_1 = false;
  }
  else {
    local_1 = false;
  }
LAB_0010efdc:
  String::~String(in_RSI);
  return local_1;
}

Assistant:

bool parseIntOption(int argc, const char* const* argv, const char* pattern, optionType type,
                        int& res) {
        String parsedValue;
        if(!parseOption(argc, argv, pattern, &parsedValue))
            return false;

        if(type == 0) {
            // boolean
            const char positive[][5] = {"1", "true", "on", "yes"};  // 5 - strlen("true") + 1
            const char negative[][6] = {"0", "false", "off", "no"}; // 6 - strlen("false") + 1

            // if the value matches any of the positive/negative possibilities
            for(unsigned i = 0; i < 4; i++) {
                if(parsedValue.compare(positive[i], true) == 0) {
                    res = 1; //!OCLINT parameter reassignment
                    return true;
                }
                if(parsedValue.compare(negative[i], true) == 0) {
                    res = 0; //!OCLINT parameter reassignment
                    return true;
                }
            }
        } else {
            // integer
            // TODO: change this to use std::stoi or something else! currently it uses undefined behavior - assumes '0' on failed parse...
            int theInt = std::atoi(parsedValue.c_str()); // NOLINT
            if(theInt != 0) {
                res = theInt; //!OCLINT parameter reassignment
                return true;
            }
        }
        return false;
    }